

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::DefaultFieldComparatorTest_BooleanComparison_Test::TestBody
          (DefaultFieldComparatorTest_BooleanComparison_Test *this)

{
  Descriptor *this_00;
  bool bVar1;
  FieldDescriptor *field_00;
  char *pcVar2;
  AssertHelper local_88;
  Message local_80;
  ComparisonResult local_78 [2];
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  Message local_48;
  ComparisonResult local_40 [2];
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  FieldDescriptor *field;
  DefaultFieldComparatorTest_BooleanComparison_Test *this_local;
  
  this_00 = (this->super_DefaultFieldComparatorTest).descriptor_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,"optional_bool")
  ;
  field_00 = Descriptor::FindFieldByName(this_00,stack0xffffffffffffffd8);
  proto2_unittest::TestAllTypes::set_optional_bool
            (&(this->super_DefaultFieldComparatorTest).message_1_,true);
  proto2_unittest::TestAllTypes::set_optional_bool
            (&(this->super_DefaultFieldComparatorTest).message_2_,true);
  local_40[1] = 0;
  local_40[0] = DefaultFieldComparator::Compare
                          (&(this->super_DefaultFieldComparatorTest).comparator_,
                           &(this->super_DefaultFieldComparatorTest).message_1_.super_Message,
                           &(this->super_DefaultFieldComparatorTest).message_2_.super_Message,
                           field_00,-1,-1,(FieldContext *)0x0);
  testing::internal::EqHelper::
  Compare<google::protobuf::util::FieldComparator::ComparisonResult,_google::protobuf::util::FieldComparator::ComparisonResult,_nullptr>
            ((EqHelper *)local_38,"FieldComparator::SAME",
             "comparator_.Compare(message_1_, message_2_, field, -1, -1, nullptr)",local_40 + 1,
             local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_comparator_test.cc"
               ,0x7a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  proto2_unittest::TestAllTypes::set_optional_bool
            (&(this->super_DefaultFieldComparatorTest).message_2_,false);
  local_78[1] = 1;
  local_78[0] = DefaultFieldComparator::Compare
                          (&(this->super_DefaultFieldComparatorTest).comparator_,
                           &(this->super_DefaultFieldComparatorTest).message_1_.super_Message,
                           &(this->super_DefaultFieldComparatorTest).message_2_.super_Message,
                           field_00,-1,-1,(FieldContext *)0x0);
  testing::internal::EqHelper::
  Compare<google::protobuf::util::FieldComparator::ComparisonResult,_google::protobuf::util::FieldComparator::ComparisonResult,_nullptr>
            ((EqHelper *)local_70,"FieldComparator::DIFFERENT",
             "comparator_.Compare(message_1_, message_2_, field, -1, -1, nullptr)",local_78 + 1,
             local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/field_comparator_test.cc"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  return;
}

Assistant:

TEST_F(DefaultFieldComparatorTest, BooleanComparison) {
  const FieldDescriptor* field = descriptor_->FindFieldByName("optional_bool");
  message_1_.set_optional_bool(true);
  message_2_.set_optional_bool(true);

  EXPECT_EQ(FieldComparator::SAME, comparator_.Compare(message_1_, message_2_,
                                                       field, -1, -1, nullptr));

  message_2_.set_optional_bool(false);
  EXPECT_EQ(
      FieldComparator::DIFFERENT,
      comparator_.Compare(message_1_, message_2_, field, -1, -1, nullptr));
}